

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextGLImpl::Begin(DeviceContextGLImpl *this,Uint32 ImmediateContextId)

{
  Char *Message;
  undefined1 local_38 [8];
  string msg;
  Uint32 ImmediateContextId_local;
  DeviceContextGLImpl *this_local;
  
  msg.field_2._12_4_ = ImmediateContextId;
  FormatString<char[42]>
            ((string *)local_38,(char (*) [42])"OpenGL does not support deferred contexts");
  Message = (Char *)std::__cxx11::string::c_str();
  DebugAssertionFailed
            (Message,"Begin",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
             ,0x54);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void DeviceContextGLImpl::Begin(Uint32 ImmediateContextId)
{
    UNEXPECTED("OpenGL does not support deferred contexts");
    (void)(ImmediateContextId);
}